

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void cmExtraEclipseCDT4Generator::AppendStorageScanners(cmXMLWriter *xml,cmMakefile *makefile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  string *runActionCommand;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string compilerArgs;
  string local_d0;
  string arg1;
  string compiler;
  string local_70;
  string local_50;
  
  paVar2 = &compiler.field_2;
  compiler._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&compiler,"CMAKE_MAKE_PROGRAM","");
  runActionCommand = cmMakefile::GetRequiredDefinition(makefile,&compiler);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compiler._M_dataplus._M_p != paVar2) {
    operator_delete(compiler._M_dataplus._M_p,compiler.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &arg1.field_2;
  arg1._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&arg1,"CMAKE_C_COMPILER","");
  psVar4 = cmMakefile::GetSafeDefinition(makefile,&arg1);
  pcVar3 = (psVar4->_M_dataplus)._M_p;
  compiler._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&compiler,pcVar3,pcVar3 + psVar4->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg1._M_dataplus._M_p != paVar1) {
    operator_delete(arg1._M_dataplus._M_p,arg1.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &compilerArgs.field_2;
  compilerArgs._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&compilerArgs,"CMAKE_C_COMPILER_ARG1","");
  psVar4 = cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
  pcVar3 = (psVar4->_M_dataplus)._M_p;
  arg1._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&arg1,pcVar3,pcVar3 + psVar4->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compilerArgs._M_dataplus._M_p != paVar2) {
    operator_delete(compilerArgs._M_dataplus._M_p,compilerArgs.field_2._M_allocated_capacity + 1);
  }
  if (compiler._M_string_length == 0) {
    compilerArgs._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&compilerArgs,"CMAKE_CXX_COMPILER","")
    ;
    cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
    std::__cxx11::string::_M_assign((string *)&compiler);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compilerArgs._M_dataplus._M_p != paVar2) {
      operator_delete(compilerArgs._M_dataplus._M_p,compilerArgs.field_2._M_allocated_capacity + 1);
    }
    compilerArgs._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&compilerArgs,"CMAKE_CXX_COMPILER_ARG1","");
    cmMakefile::GetSafeDefinition(makefile,&compilerArgs);
    std::__cxx11::string::_M_assign((string *)&arg1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)compilerArgs._M_dataplus._M_p != paVar2) {
      operator_delete(compilerArgs._M_dataplus._M_p,compilerArgs.field_2._M_allocated_capacity + 1);
    }
    if (compiler._M_string_length == 0) {
      std::__cxx11::string::_M_replace((ulong)&compiler,0,(char *)0x0,0x77e71a);
    }
  }
  compilerArgs._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&compilerArgs,"-E -P -v -dD ${plugin_state_location}/${specs_file}","");
  if (arg1._M_string_length != 0) {
    std::__cxx11::string::append((char *)&arg1);
    std::operator+(&local_110,&arg1,&compilerArgs);
    std::__cxx11::string::operator=((string *)&compilerArgs,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  paVar2 = &local_110.field_2;
  local_110._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"storageModule","");
  cmXMLWriter::StartElement(xml,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[21]>(xml,"moduleId",(char (*) [21])"scannerConfiguration");
  local_110._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"autodiscovery","");
  cmXMLWriter::StartElement(xml,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::Attribute<char[5]>(xml,"enabled",(char (*) [5])0x7a5454);
  cmXMLWriter::Attribute<char[5]>(xml,"problemReportingEnabled",(char (*) [5])0x7a5454);
  cmXMLWriter::Attribute<char[59]>
            (xml,"selectedProfileId",
             (char (*) [59])"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile");
  cmXMLWriter::EndElement(xml);
  local_110._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"specsFile","");
  AppendScannerProfile
            (xml,&local_110,true,&local_d0,true,&local_70,&compilerArgs,&compiler,true,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_110,"org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"makefileGenerator","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"-f ${project_name}_scd.mk","");
  AppendScannerProfile
            (xml,&local_110,true,&local_d0,true,&local_70,&local_50,runActionCommand,true,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::EndElement(xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compilerArgs._M_dataplus._M_p != &compilerArgs.field_2) {
    operator_delete(compilerArgs._M_dataplus._M_p,compilerArgs.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)arg1._M_dataplus._M_p != &arg1.field_2) {
    operator_delete(arg1._M_dataplus._M_p,arg1.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)compiler._M_dataplus._M_p != &compiler.field_2) {
    operator_delete(compiler._M_dataplus._M_p,compiler.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendStorageScanners(
  cmXMLWriter& xml, const cmMakefile& makefile)
{
  // we need the "make" and the C (or C++) compiler which are used, Alex
  const std::string& make =
    makefile.GetRequiredDefinition("CMAKE_MAKE_PROGRAM");
  std::string compiler = makefile.GetSafeDefinition("CMAKE_C_COMPILER");
  std::string arg1 = makefile.GetSafeDefinition("CMAKE_C_COMPILER_ARG1");
  if (compiler.empty()) {
    compiler = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER");
    arg1 = makefile.GetSafeDefinition("CMAKE_CXX_COMPILER_ARG1");
  }
  if (compiler.empty()) // Hmm, what to do now ?
  {
    compiler = "gcc";
  }

  // the following right now hardcodes gcc behavior :-/
  std::string compilerArgs =
    "-E -P -v -dD ${plugin_state_location}/${specs_file}";
  if (!arg1.empty()) {
    arg1 += " ";
    compilerArgs = arg1 + compilerArgs;
  }

  xml.StartElement("storageModule");
  xml.Attribute("moduleId", "scannerConfiguration");

  xml.StartElement("autodiscovery");
  xml.Attribute("enabled", "true");
  xml.Attribute("problemReportingEnabled", "true");
  xml.Attribute("selectedProfileId",
                "org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile");
  xml.EndElement(); // autodiscovery

  cmExtraEclipseCDT4Generator::AppendScannerProfile(
    xml, "org.eclipse.cdt.make.core.GCCStandardMakePerProjectProfile", true,
    "", true, "specsFile", compilerArgs, compiler, true, true);
  cmExtraEclipseCDT4Generator::AppendScannerProfile(
    xml, "org.eclipse.cdt.make.core.GCCStandardMakePerFileProfile", true, "",
    true, "makefileGenerator", "-f ${project_name}_scd.mk", make, true, true);

  xml.EndElement(); // storageModule
}